

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall
Qentem::Array<Qentem::QExpression>::operator+=(Array<Qentem::QExpression> *this,QExpression *item)

{
  uint uVar1;
  
  uVar1 = this->index_;
  if (uVar1 == this->capacity_) {
    resize(this,(uVar1 == 0 | uVar1) * 2);
    uVar1 = this->index_;
  }
  QExpression::QExpression(this->storage_ + uVar1,item);
  this->index_ = this->index_ + 1;
  return;
}

Assistant:

void operator+=(Type_T &&item) {
        if (Size() == Capacity()) {
            resize((Capacity() | (Capacity() == 0)) * SizeT{2});
        }

        Memory::Initialize((Storage() + Size()), Memory::Move(item));
        ++index_;
    }